

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::HardenedPrintString
          (Printer *this,string_view src,BaseTextGenerator *generator)

{
  Printer *pPVar1;
  byte bVar2;
  long lVar3;
  int *piVar4;
  size_t sVar5;
  Printer *pPVar6;
  Printer *pPVar7;
  long *plVar8;
  Printer *pPVar9;
  ulong len;
  Printer *unaff_R12;
  Printer *pPVar10;
  Printer *pPVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  string_view src_00;
  string local_50;
  
  plVar8 = (long *)src._M_str;
  sVar13 = src._M_len;
  (**(code **)(*plVar8 + 0x28))(plVar8,"\"",1);
  do {
    if (this == (Printer *)0x0) break;
    pPVar10 = (Printer *)0x0;
    pPVar9 = unaff_R12;
    do {
      bVar2 = *(byte *)((long)&pPVar10->initial_indent_level_ + sVar13);
      if ((char)bVar2 < '\0') {
        pPVar6 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1);
        pPVar7 = pPVar10;
        if (pPVar6 < this) {
          pPVar6 = this;
        }
        do {
          pPVar1 = (Printer *)((long)&pPVar7->initial_indent_level_ + 1);
          pPVar11 = pPVar6;
          if (this <= pPVar1) break;
          piVar4 = &pPVar7->initial_indent_level_;
          pPVar7 = pPVar1;
          pPVar11 = pPVar1;
        } while (*(char *)((long)piVar4 + sVar13 + 1) < '\0');
        if (this < pPVar10) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pPVar10,this);
        }
        uVar12 = (long)pPVar11 - (long)pPVar10;
        len = (long)this - (long)pPVar10;
        if (uVar12 <= (ulong)((long)this - (long)pPVar10)) {
          len = uVar12;
        }
        sVar5 = utf8_range_ValidPrefix((char *)((long)&pPVar10->initial_indent_level_ + sVar13),len)
        ;
        pPVar6 = (Printer *)((long)&pPVar10->initial_indent_level_ + sVar5);
        bVar14 = sVar5 == uVar12;
        lVar3 = sVar5 - 1;
        if (!bVar14) {
          pPVar9 = pPVar6;
          lVar3 = 0;
        }
        pPVar10 = (Printer *)((long)&pPVar10->initial_indent_level_ + lVar3);
      }
      else {
        pPVar6 = (Printer *)(ulong)(bVar2 - 0x20);
        if (((byte)(bVar2 - 0x20) < 0x5f) &&
           ((0x3a < bVar2 - 0x22 ||
            (pPVar6 = (Printer *)0x400000000000021,
            (0x400000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)))) {
          bVar14 = true;
        }
        else {
          bVar14 = false;
          pPVar9 = pPVar10;
        }
      }
      unaff_R12 = pPVar9;
    } while ((bVar14) &&
            (pPVar10 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1), unaff_R12 = this,
            pPVar10 < this));
    if (unaff_R12 == (Printer *)0x0) {
LAB_002b69f4:
      src_00._M_str = (char *)pPVar6;
      src_00._M_len = sVar13;
      absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)0x1,src_00);
      (**(code **)(*plVar8 + 0x28))(plVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      sVar13 = sVar13 + 1;
      this = (Printer *)((long)&this[-1].finder_ + 7);
      bVar14 = true;
    }
    else {
      pPVar9 = unaff_R12;
      if (this < unaff_R12) {
        pPVar9 = this;
      }
      (**(code **)(*plVar8 + 0x28))(plVar8,sVar13,pPVar9);
      sVar13 = (long)&unaff_R12->initial_indent_level_ + sVar13;
      this = (Printer *)((long)this - (long)unaff_R12);
      if (this != (Printer *)0x0) goto LAB_002b69f4;
      bVar14 = false;
    }
  } while (bVar14);
  (**(code **)(*plVar8 + 0x28))(plVar8,"\"",1);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}